

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateAssignment(ExpressionEvalContext *ctx,ExprAssignment *expression)

{
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  ExprBase *value;
  ExprBase *rhs;
  ExprBase *lhs;
  ExprAssignment *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar2)->targetYield != 0)) {
    pEVar3 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar3,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return pEVar3;
  }
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    pEVar3 = Evaluate(ctx,expression->lhs);
    value = Evaluate(ctx,expression->rhs);
    if ((pEVar3 == (ExprBase *)0x0) || (value == (ExprBase *)0x0)) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      bVar1 = CreateStore(ctx,pEVar3,value);
      if (bVar1) {
        ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,value);
      }
      else {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateAssignment(ExpressionEvalContext &ctx, ExprAssignment *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *lhs = Evaluate(ctx, expression->lhs);
	ExprBase *rhs = Evaluate(ctx, expression->rhs);

	if(!lhs || !rhs)
		return NULL;

	if(!CreateStore(ctx, lhs, rhs))
		return NULL;

	return CheckType(expression, rhs);
}